

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emit.h
# Opt level: O2

string * re2c::replaceParam<unsigned_int>
                   (string *__return_storage_ptr__,string *str,string *param,uint *value)

{
  string *psVar1;
  ulong uVar2;
  ostringstream strValue;
  string local_1c8 [32];
  ostringstream local_1a8 [376];
  
  if (param->_M_string_length != 0) {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    while( true ) {
      uVar2 = std::__cxx11::string::find((string *)str,(ulong)param);
      if (uVar2 == 0xffffffffffffffff) break;
      psVar1 = (string *)param->_M_string_length;
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::replace((ulong)str,uVar2,psVar1);
      std::__cxx11::string::~string(local_1c8);
    }
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  return __return_storage_ptr__;
}

Assistant:

std::string replaceParam (std::string str, const std::string & param, const _Ty & value)
{
	if (!param.empty ())
	{
		std::ostringstream strValue;
		strValue << value;
		std::string::size_type pos;
		while((pos = str.find(param)) != std::string::npos)
		{
			str.replace(pos, param.length(), strValue.str());
		}
	}
	return str;
}